

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xviexpdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i64 dst_01;
  TCGv_i64 dst_02;
  TCGv_i64 xbl;
  TCGv_i64 xbh;
  TCGv_i64 xal;
  TCGv_i64 xah;
  TCGv_i64 xtl;
  TCGv_i64 xth;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst = tcg_temp_new_i64(tcg_ctx_00);
    dst_00 = tcg_temp_new_i64(tcg_ctx_00);
    dst_01 = tcg_temp_new_i64(tcg_ctx_00);
    dst_02 = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = xA(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst,uVar1);
    uVar1 = xA(ctx->opcode);
    get_cpu_vsrl(tcg_ctx_00,dst_00,uVar1);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrh(tcg_ctx_00,dst_01,uVar1);
    uVar1 = xB(ctx->opcode);
    get_cpu_vsrl(tcg_ctx_00,dst_02,uVar1);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,dst,dst_01,0x34,0xb);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,ret);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret_00,dst_00,dst_02,0x34,0xb);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrl(tcg_ctx_00,uVar1,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,dst_00);
    tcg_temp_free_i64(tcg_ctx_00,dst_01);
    tcg_temp_free_i64(tcg_ctx_00,dst_02);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xviexpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xah;
    TCGv_i64 xal;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xah = tcg_temp_new_i64(tcg_ctx);
    xal = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xah, xA(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xal, xA(ctx->opcode));
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    tcg_gen_deposit_i64(tcg_ctx, xth, xah, xbh, 52, 11);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);

    tcg_gen_deposit_i64(tcg_ctx, xtl, xal, xbl, 52, 11);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xah);
    tcg_temp_free_i64(tcg_ctx, xal);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}